

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LPO.cpp
# Opt level: O0

Result __thiscall
Kernel::LPO::lexMAE(LPO *this,AppliedTerm s,AppliedTerm t,TermList *sl,TermList *tl,uint arity)

{
  AppliedTerm parent;
  AppliedTerm parent_00;
  AppliedTerm s_00;
  AppliedTerm s_01;
  AppliedTerm t_00;
  AppliedTerm t_01;
  AppliedTerm tt1;
  Result RVar1;
  uint in_ECX;
  long in_RDX;
  SubstApplicator *in_RDI;
  SubstApplicator *unaff_retaddr;
  AppliedTerm in_stack_00000008;
  uint i;
  AppliedTerm *in_stack_fffffffffffffec8;
  TermList in_stack_fffffffffffffed0;
  undefined1 *puVar2;
  undefined8 *puVar3;
  undefined8 in_stack_ffffffffffffff38;
  TermList *in_stack_ffffffffffffff40;
  LPO *in_stack_ffffffffffffff48;
  undefined8 uVar4;
  undefined8 uVar5;
  SubstApplicator *in_stack_ffffffffffffff70;
  undefined8 uVar6;
  undefined8 in_stack_ffffffffffffff80;
  AppliedTerm *in_stack_ffffffffffffff88;
  uint64_t local_70;
  uint uVar7;
  SubstApplicator *pSVar8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  puVar2 = &stack0x00000020;
  puVar3 = (undefined8 *)&stack0x00000008;
  uVar7 = 0;
  pSVar8 = in_RDI;
  while( true ) {
    if (in_ECX <= uVar7) {
      return EQUAL;
    }
    parent._8_8_ = puVar3;
    parent.term._content = (uint64_t)puVar2;
    parent.applicator = in_RDI;
    AppliedTerm::AppliedTerm(in_stack_fffffffffffffec8,in_stack_fffffffffffffed0,parent);
    uVar6 = *(undefined8 *)(in_RDX + (ulong)uVar7 * -8);
    uVar5 = *(undefined8 *)(puVar2 + 0x10);
    uVar4 = *(undefined8 *)(puVar2 + 8);
    parent_00._8_8_ = puVar3;
    parent_00.term._content = (uint64_t)puVar2;
    parent_00.applicator = in_RDI;
    AppliedTerm::AppliedTerm(in_stack_fffffffffffffec8,in_stack_fffffffffffffed0,parent_00);
    in_stack_fffffffffffffec8 = in_stack_ffffffffffffff88;
    tt1._8_4_ = in_stack_fffffffffffffff8;
    tt1.term._content = (uint64_t)pSVar8;
    tt1._12_4_ = in_stack_fffffffffffffffc;
    tt1.applicator = unaff_retaddr;
    in_stack_fffffffffffffed0._content = local_70;
    in_stack_ffffffffffffff88 = in_stack_fffffffffffffec8;
    RVar1 = lpo((LPO *)CONCAT44(in_ECX,uVar7),tt1,in_stack_00000008);
    if (RVar1 == GREATER) break;
    if (RVar1 != EQUAL) {
      s_01._8_8_ = uVar5;
      s_01.term._content = uVar4;
      s_01.applicator = in_stack_ffffffffffffff70;
      t_01._8_8_ = in_stack_ffffffffffffff80;
      t_01.term._content = uVar6;
      t_01.applicator = (SubstApplicator *)in_stack_ffffffffffffff88;
      RVar1 = alpha(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                    (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20),s_01,t_01);
      return RVar1;
    }
    uVar7 = uVar7 + 1;
  }
  s_00._8_8_ = uVar5;
  s_00.term._content = uVar4;
  s_00.applicator = in_stack_ffffffffffffff70;
  t_00._8_8_ = in_stack_ffffffffffffff80;
  t_00.term._content = uVar6;
  t_00.applicator = (SubstApplicator *)in_stack_ffffffffffffff88;
  RVar1 = majo((LPO *)puVar3[1],s_00,t_00,(TermList *)*puVar3,
               (uint)((ulong)*(undefined8 *)(puVar2 + 0x10) >> 0x20));
  return RVar1;
}

Assistant:

Ordering::Result LPO::lexMAE(AppliedTerm s, AppliedTerm t, const TermList* sl, const TermList* tl, unsigned arity) const
{
  for (unsigned i = 0; i < arity; i++) {
    switch (lpo(AppliedTerm(*(sl - i),s), AppliedTerm(*(tl - i),t))) {
    case EQUAL:
      break;
    case GREATER:
      return majo(s, t, tl - i - 1, arity - i - 1);
    case INCOMPARABLE:
      return alpha(sl - i - 1, arity - i - 1, s, t);
    default:
      ASSERTION_VIOLATION;
    }
  }
  return EQUAL;
}